

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O3

string * __thiscall
pbrt::syntactic::Loc::toString_abi_cxx11_(string *__return_storage_ptr__,Loc *this)

{
  size_type *psVar1;
  uint uVar2;
  element_type *peVar3;
  uint uVar4;
  undefined8 uVar5;
  uint uVar6;
  long *plVar7;
  undefined8 *puVar8;
  uint uVar9;
  long *plVar10;
  ulong *puVar11;
  ulong uVar12;
  uint uVar13;
  string __str;
  string __str_1;
  ulong *local_110;
  long local_108;
  ulong local_100 [2];
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  peVar3 = (this->file).super___shared_ptr<pbrt::syntactic::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_70[0] = local_60;
  if (peVar3 == (element_type *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"<invalid>","");
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,*(long *)(peVar3 + 8),
               *(long *)(peVar3 + 0x10) + *(long *)(peVar3 + 8));
  }
  plVar7 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x14c82f);
  local_50 = &local_40;
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_40 = *plVar10;
    lStack_38 = plVar7[3];
  }
  else {
    local_40 = *plVar10;
    local_50 = (long *)*plVar7;
  }
  local_48 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_e0 = *puVar11;
    lStack_d8 = plVar7[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar11;
    local_f0 = (ulong *)*plVar7;
  }
  local_e8 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  uVar2 = this->line;
  uVar4 = -uVar2;
  if (0 < (int)uVar2) {
    uVar4 = uVar2;
  }
  uVar13 = 1;
  if (9 < uVar4) {
    uVar12 = (ulong)uVar4;
    uVar6 = 4;
    do {
      uVar13 = uVar6;
      uVar9 = (uint)uVar12;
      if (uVar9 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_0012ab09;
      }
      if (uVar9 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_0012ab09;
      }
      if (uVar9 < 10000) goto LAB_0012ab09;
      uVar12 = uVar12 / 10000;
      uVar6 = uVar13 + 4;
    } while (99999 < uVar9);
    uVar13 = uVar13 + 1;
  }
LAB_0012ab09:
  local_110 = local_100;
  std::__cxx11::string::_M_construct((ulong)&local_110,(char)uVar13 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_110),uVar13,uVar4);
  uVar12 = 0xf;
  if (local_f0 != &local_e0) {
    uVar12 = local_e0;
  }
  if (uVar12 < (ulong)(local_108 + local_e8)) {
    uVar12 = 0xf;
    if (local_110 != local_100) {
      uVar12 = local_100[0];
    }
    if (uVar12 < (ulong)(local_108 + local_e8)) goto LAB_0012ab80;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_f0);
  }
  else {
LAB_0012ab80:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_110);
  }
  local_d0 = &local_c0;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_c0 = *plVar7;
    uStack_b8 = puVar8[3];
  }
  else {
    local_c0 = *plVar7;
    local_d0 = (long *)*puVar8;
  }
  local_c8 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_d0);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_a0 = *puVar11;
    lStack_98 = plVar7[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *puVar11;
    local_b0 = (ulong *)*plVar7;
  }
  local_a8 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  uVar2 = this->col;
  uVar4 = -uVar2;
  if (0 < (int)uVar2) {
    uVar4 = uVar2;
  }
  uVar13 = 1;
  if (9 < uVar4) {
    uVar12 = (ulong)uVar4;
    uVar6 = 4;
    do {
      uVar13 = uVar6;
      uVar9 = (uint)uVar12;
      if (uVar9 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_0012ac9b;
      }
      if (uVar9 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_0012ac9b;
      }
      if (uVar9 < 10000) goto LAB_0012ac9b;
      uVar12 = uVar12 / 10000;
      uVar6 = uVar13 + 4;
    } while (99999 < uVar9);
    uVar13 = uVar13 + 1;
  }
LAB_0012ac9b:
  local_90 = local_80;
  std::__cxx11::string::_M_construct((ulong)&local_90,(char)uVar13 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_90),uVar13,uVar4);
  uVar12 = 0xf;
  if (local_b0 != &local_a0) {
    uVar12 = local_a0;
  }
  if (uVar12 < (ulong)(local_88 + local_a8)) {
    uVar12 = 0xf;
    if (local_90 != local_80) {
      uVar12 = local_80[0];
    }
    if ((ulong)(local_88 + local_a8) <= uVar12) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_b0);
      goto LAB_0012ad3c;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90);
LAB_0012ad3c:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar8 + 2;
  if ((size_type *)*puVar8 == psVar1) {
    uVar5 = puVar8[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar8;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar8[1];
  *puVar8 = psVar1;
  puVar8[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_110 != local_100) {
    operator_delete(local_110,local_100[0] + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toString() const {
        return "@" + (file?file->getFileName():"<invalid>") + ":" + std::to_string(line) + "." + std::to_string(col);
      }